

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

size_t bitset_extract_setbits_avx2
                 (uint64_t *words,size_t length,uint32_t *out,size_t outcapacity,uint32_t base)

{
  undefined1 (*pauVar1) [32];
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  ulong uVar7;
  int iVar8;
  undefined1 (*pauVar9) [32];
  byte bVar11;
  ulong uVar10;
  uint64_t uVar12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  
  pauVar1 = (undefined1 (*) [32])(out + outcapacity);
  pauVar9 = (undefined1 (*) [32])out;
  if ((long)outcapacity < 0x40 || length == 0) {
    uVar13 = 0;
  }
  else {
    iVar8 = base - 1;
    auVar15 = ZEXT3264(CONCAT428(iVar8,CONCAT424(iVar8,CONCAT420(iVar8,CONCAT416(iVar8,CONCAT412(
                                                  iVar8,CONCAT48(iVar8,CONCAT44(iVar8,iVar8))))))));
    auVar16._8_4_ = 0x40;
    auVar16._0_8_ = 0x4000000040;
    auVar16._12_4_ = 0x40;
    auVar16._16_4_ = 0x40;
    auVar16._20_4_ = 0x40;
    auVar16._24_4_ = 0x40;
    auVar16._28_4_ = 0x40;
    uVar13 = 0;
    auVar17._8_4_ = 8;
    auVar17._0_8_ = 0x800000008;
    auVar17._12_4_ = 8;
    auVar17._16_4_ = 8;
    auVar17._20_4_ = 8;
    auVar17._24_4_ = 8;
    auVar17._28_4_ = 8;
    auVar18._8_4_ = 0x10;
    auVar18._0_8_ = 0x1000000010;
    auVar18._12_4_ = 0x10;
    auVar18._16_4_ = 0x10;
    auVar18._20_4_ = 0x10;
    auVar18._24_4_ = 0x10;
    auVar18._28_4_ = 0x10;
    do {
      if (words[uVar13] == 0) {
        auVar4 = vpaddd_avx2(auVar15._0_32_,auVar16);
        auVar15 = ZEXT3264(auVar4);
      }
      else {
        iVar8 = 4;
        uVar12 = words[uVar13];
        do {
          bVar2 = ""[uVar12 & 0xff];
          bVar11 = (byte)(uVar12 >> 8);
          bVar3 = ""[bVar11];
          auVar14 = auVar15._0_32_;
          auVar4 = vpaddd_avx2(auVar14,*(undefined1 (*) [32])
                                        ((long)vecDecodeTable[0] +
                                        (ulong)(uint)((int)(uVar12 & 0xff) << 5)));
          auVar5 = vpaddd_avx2(auVar14,(undefined1  [32])vecDecodeTable[bVar11]);
          auVar5 = vpaddd_avx2(auVar5,auVar17);
          auVar14 = vpaddd_avx2(auVar14,auVar18);
          auVar15 = ZEXT3264(auVar14);
          *pauVar9 = auVar4;
          *(undefined1 (*) [32])(*pauVar9 + (ulong)bVar2 * 4) = auVar5;
          pauVar9 = (undefined1 (*) [32])
                    (*(undefined1 (*) [32])(*pauVar9 + (ulong)bVar2 * 4) + (ulong)bVar3 * 4);
          iVar8 = iVar8 + -1;
          uVar12 = uVar12 >> 0x10;
        } while (iVar8 != 0);
      }
      uVar13 = uVar13 + 1;
    } while ((uVar13 < length) && (pauVar9 + 8 <= pauVar1));
  }
  if ((uVar13 < length) && (pauVar9 < pauVar1)) {
    iVar8 = (int)uVar13 * 0x40 + base;
    do {
      uVar10 = words[uVar13];
      if (uVar10 != 0) {
        do {
          iVar6 = 0;
          for (uVar7 = uVar10; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
            iVar6 = iVar6 + 1;
          }
          *(int *)*pauVar9 = iVar6 + iVar8;
          pauVar9 = (undefined1 (*) [32])(*pauVar9 + 4);
          uVar10 = uVar10 - 1 & uVar10;
        } while ((uVar10 != 0) && (pauVar9 < pauVar1));
      }
      uVar13 = uVar13 + 1;
    } while ((uVar13 < length) && (iVar8 = iVar8 + 0x40, pauVar9 < pauVar1));
  }
  return (long)pauVar9 - (long)out >> 2;
}

Assistant:

CROARING_TARGET_AVX2
size_t bitset_extract_setbits_avx2(const uint64_t *words, size_t length,
                                   uint32_t *out, size_t outcapacity,
                                   uint32_t base) {
    uint32_t *initout = out;
    __m256i baseVec = _mm256_set1_epi32(base - 1);
    __m256i incVec = _mm256_set1_epi32(64);
    __m256i add8 = _mm256_set1_epi32(8);
    uint32_t *safeout = out + outcapacity;
    size_t i = 0;
    for (; (i < length) && (out + 64 <= safeout); ++i) {
        uint64_t w = words[i];
        if (w == 0) {
            baseVec = _mm256_add_epi32(baseVec, incVec);
        } else {
            for (int k = 0; k < 4; ++k) {
                uint8_t byteA = (uint8_t)w;
                uint8_t byteB = (uint8_t)(w >> 8);
                w >>= 16;
                __m256i vecA =
                    _mm256_load_si256((const __m256i *)vecDecodeTable[byteA]);
                __m256i vecB =
                    _mm256_load_si256((const __m256i *)vecDecodeTable[byteB]);
                uint8_t advanceA = lengthTable[byteA];
                uint8_t advanceB = lengthTable[byteB];
                vecA = _mm256_add_epi32(baseVec, vecA);
                baseVec = _mm256_add_epi32(baseVec, add8);
                vecB = _mm256_add_epi32(baseVec, vecB);
                baseVec = _mm256_add_epi32(baseVec, add8);
                _mm256_storeu_si256((__m256i *)out, vecA);
                out += advanceA;
                _mm256_storeu_si256((__m256i *)out, vecB);
                out += advanceB;
            }
        }
    }
    base += i * 64;
    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            uint64_t t = w & (~w + 1); // on x64, should compile to BLSI (careful: the Intel compiler seems to fail)
            int r = __builtin_ctzll(w); // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            out++;
            w ^= t;
        }
        base += 64;
    }
    return out - initout;
}